

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O2

void duckdb_je_san_guard_pages
               (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,emap_t *emap,_Bool left,_Bool right,
               _Bool remap)

{
  byte *pbVar1;
  void *guard2;
  void *guard1;
  void *pvVar2;
  ulong uVar3;
  
  if (remap) {
    duckdb_je_emap_deregister_boundary(tsdn,emap,edata);
  }
  uVar3 = (ulong)(byte)~right << 0xc | 0xffffffffffffe000;
  if (!left) {
    uVar3 = 0xfffffffffffff000;
  }
  uVar3 = uVar3 + ((edata->field_2).e_size_esn & 0xfffffffffffff000);
  guard1 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  pvVar2 = (void *)((ulong)left * 0x1000 + (long)guard1);
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    guard2 = (void *)(uVar3 + (long)pvVar2);
    if (!right) {
      guard2 = (void *)0x0;
    }
    if (!left) {
      guard1 = (void *)0x0;
    }
    duckdb_je_ehooks_default_guard_impl(guard1,guard2);
  }
  (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | uVar3;
  edata->e_addr = pvVar2;
  pbVar1 = (byte *)((long)&edata->e_bits + 2);
  *pbVar1 = *pbVar1 | 1;
  if (remap) {
    duckdb_je_emap_register_boundary(tsdn,emap,edata,0xe8,false);
    return;
  }
  return;
}

Assistant:

void
san_guard_pages(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata, emap_t *emap,
    bool left, bool right, bool remap) {
	assert(left || right);
	if (remap) {
		emap_deregister_boundary(tsdn, emap, edata);
	}

	size_t size_with_guards = edata_size_get(edata);
	size_t usize = (left && right)
	    ? san_two_side_unguarded_sz(size_with_guards)
	    : san_one_side_unguarded_sz(size_with_guards);

	void *guard1, *guard2, *addr;
	san_find_guarded_addr(edata, &guard1, &guard2, &addr, usize, left,
	    right);

	assert(edata_state_get(edata) == extent_state_active);
	ehooks_guard(tsdn, ehooks, guard1, guard2);

	/* Update the guarded addr and usable size of the edata. */
	edata_size_set(edata, usize);
	edata_addr_set(edata, addr);
	edata_guarded_set(edata, true);

	if (remap) {
		emap_register_boundary(tsdn, emap, edata, SC_NSIZES,
		    /* slab */ false);
	}
}